

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void * stbir_resize(void *input_pixels,int input_w,int input_h,int input_stride_in_bytes,
                   void *output_pixels,int output_w,int output_h,int output_stride_in_bytes,
                   stbir_pixel_layout pixel_layout,stbir_datatype data_type,stbir_edge edge,
                   stbir_filter filter)

{
  int iVar1;
  void *local_140;
  void *local_138;
  int local_11c;
  void *pvStack_118;
  int opitch;
  float *optr;
  STBIR_RESIZE resize;
  int output_w_local;
  void *output_pixels_local;
  int input_stride_in_bytes_local;
  int input_h_local;
  int input_w_local;
  void *input_pixels_local;
  
  resize.samplers._4_4_ = output_w;
  iVar1 = stbir__check_output_stuff
                    (&stack0xfffffffffffffee8,&local_11c,output_pixels,
                     (uint)stbir__type_size[data_type],output_w,output_h,output_stride_in_bytes,
                     stbir__pixel_layout_convert_public_to_internal[pixel_layout]);
  if (iVar1 == 0) {
    input_pixels_local = (void *)0x0;
  }
  else {
    local_138 = output_pixels;
    if (pvStack_118 != (void *)0x0) {
      local_138 = pvStack_118;
    }
    stbir_resize_init((STBIR_RESIZE *)&optr,input_pixels,input_w,input_h,input_stride_in_bytes,
                      local_138,resize.samplers._4_4_,output_h,output_stride_in_bytes,pixel_layout,
                      data_type);
    resize.horizontal_filter = edge;
    resize.vertical_filter = edge;
    resize.input_data_type = filter;
    resize.output_data_type = filter;
    iVar1 = stbir_resize_extended((STBIR_RESIZE *)&optr);
    if (iVar1 == 0) {
      if (pvStack_118 != (void *)0x0) {
        free(pvStack_118);
      }
      input_pixels_local = (void *)0x0;
    }
    else {
      local_140 = output_pixels;
      if (pvStack_118 != (void *)0x0) {
        local_140 = pvStack_118;
      }
      input_pixels_local = local_140;
    }
  }
  return input_pixels_local;
}

Assistant:

STBIRDEF void * stbir_resize( const void *input_pixels , int input_w , int input_h, int input_stride_in_bytes,
                                    void *output_pixels, int output_w, int output_h, int output_stride_in_bytes,
                              stbir_pixel_layout pixel_layout, stbir_datatype data_type,
                              stbir_edge edge, stbir_filter filter )
{
  STBIR_RESIZE resize;
  float * optr;
  int opitch;

  if ( !stbir__check_output_stuff( (void**)&optr, &opitch, output_pixels, stbir__type_size[data_type], output_w, output_h, output_stride_in_bytes, stbir__pixel_layout_convert_public_to_internal[ pixel_layout ] ) )
    return 0;

  stbir_resize_init( &resize,
                     input_pixels,  input_w,  input_h,  input_stride_in_bytes,
                     (optr) ? optr : output_pixels, output_w, output_h, output_stride_in_bytes,
                     pixel_layout, data_type );

  resize.horizontal_edge = edge;
  resize.vertical_edge = edge;
  resize.horizontal_filter = filter;
  resize.vertical_filter = filter;

  if ( !stbir_resize_extended( &resize ) )
  {
    if ( optr )
      STBIR_FREE( optr, 0 );
    return 0;
  }

  return (optr) ? optr : output_pixels;
}